

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

_Bool run_container_iterate(run_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int i;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  for (lVar4 = 0; iVar1 = cont->n_runs, lVar4 < iVar1; lVar4 = lVar4 + 1) {
    iVar5 = cont->runs[lVar4].length + 1;
    uVar3 = cont->runs[lVar4].value + base;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      _Var2 = (*iterator)(uVar3,ptr);
      uVar3 = uVar3 + 1;
      if (!_Var2) goto LAB_00106507;
    }
  }
LAB_00106507:
  return iVar1 <= lVar4;
}

Assistant:

bool run_container_iterate(const run_container_t *cont, uint32_t base,
                           roaring_iterator iterator, void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(run_start + j, ptr)) return false;
    }
    return true;
}